

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask13_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xd | *out;
  *out = in[2] << 0x1a | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 6;
  *puVar1 = in[3] << 7 | *puVar1;
  *puVar1 = in[4] << 0x14 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = in[5] << 1 | *puVar1;
  *puVar1 = in[6] << 0xe | *puVar1;
  *puVar1 = in[7] << 0x1b | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[7] >> 5;
  *puVar1 = in[8] << 8 | *puVar1;
  *puVar1 = in[9] << 0x15 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[9] >> 0xb;
  *puVar1 = in[10] << 2 | *puVar1;
  *puVar1 = in[0xb] << 0xf | *puVar1;
  *puVar1 = in[0xc] << 0x1c | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[0xc] >> 4;
  *puVar1 = in[0xd] << 9 | *puVar1;
  *puVar1 = in[0xe] << 0x16 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[0xe] >> 10;
  *puVar1 = in[0xf] << 3 | *puVar1;
  *puVar1 = in[0x10] << 0x10 | *puVar1;
  *puVar1 = in[0x11] << 0x1d | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0x11] >> 3;
  *puVar1 = in[0x12] << 10 | *puVar1;
  *puVar1 = in[0x13] << 0x17 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0x13] >> 9;
  *puVar1 = in[0x14] << 4 | *puVar1;
  *puVar1 = in[0x15] << 0x11 | *puVar1;
  *puVar1 = in[0x16] << 0x1e | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0x16] >> 2;
  *puVar1 = in[0x17] << 0xb | *puVar1;
  *puVar1 = in[0x18] << 0x18 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x18] >> 8;
  *puVar1 = in[0x19] << 5 | *puVar1;
  *puVar1 = in[0x1a] << 0x12 | *puVar1;
  *puVar1 = in[0x1b] << 0x1f | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0x1b] >> 1;
  *puVar1 = in[0x1c] << 0xc | *puVar1;
  *puVar1 = in[0x1d] << 0x19 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0x1d] >> 7;
  *puVar1 = in[0x1e] << 6 | *puVar1;
  *puVar1 = in[0x1f] << 0x13 | *puVar1;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask13_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (13 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (13 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (13 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (13 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (13 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (13 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (13 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (13 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (13 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (13 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (13 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (13 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  ++in;

  return out;
}